

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SplitterBehavior
               (ImRect *bb,ImGuiID id,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend,float hover_visibility_delay)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 col;
  ImGuiCol idx;
  char cVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  bool held;
  bool hovered;
  ImRect bb_render;
  ImRect bb_interact;
  bool local_8a;
  bool local_89;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  ImVec2 local_78;
  ImVec2 IStack_70;
  float *local_68;
  float *local_60;
  ImRect local_58;
  ImGuiWindow *local_40;
  ImGuiContext *local_38;
  
  local_38 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  uVar5 = (pIVar1->DC).ItemFlags;
  (pIVar1->DC).ItemFlags = uVar5 | 0x18;
  local_88 = hover_visibility_delay;
  local_84 = min_size2;
  local_80 = min_size1;
  local_7c = hover_extend;
  local_68 = size1;
  local_60 = size2;
  bVar3 = ItemAdd(bb,id,(ImRect *)0x0);
  (pIVar1->DC).ItemFlags = uVar5;
  cVar4 = '\0';
  if (bVar3) {
    fVar6 = 0.0;
    fVar8 = local_7c;
    if (axis == ImGuiAxis_Y) {
      fVar6 = local_7c;
      fVar8 = 0.0;
    }
    local_58.Min.x = (bb->Min).x;
    local_58.Min.y = (bb->Min).y;
    local_58.Min.y = local_58.Min.y - fVar6;
    local_58.Min.x = local_58.Min.x - fVar8;
    local_58.Max.x = (bb->Max).x;
    local_58.Max.y = (bb->Max).y;
    local_58.Max.y = fVar6 + local_58.Max.y;
    local_58.Max.x = fVar8 + local_58.Max.x;
    local_40 = pIVar1;
    ButtonBehavior(&local_58,id,&local_89,&local_8a,0x60);
    pIVar2 = local_38;
    if (local_38->ActiveId != id) {
      SetItemAllowOverlap();
    }
    if ((local_8a != false) ||
       (((pIVar2->HoveredId == id && (pIVar2->HoveredIdPreviousFrame == id)) &&
        (local_88 <= pIVar2->HoveredIdTimer)))) {
      SetMouseCursor((axis != ImGuiAxis_Y) + 3);
    }
    local_78 = bb->Min;
    IStack_70 = bb->Max;
    if (local_8a == true) {
      if (axis == ImGuiAxis_Y) {
        fVar6 = ((pIVar2->IO).MousePos.y - (pIVar2->ActiveIdClickOffset).y) - local_58.Min.y;
      }
      else {
        fVar6 = ((pIVar2->IO).MousePos.x - (pIVar2->ActiveIdClickOffset).x) - local_58.Min.x;
      }
      fVar7 = *local_68 - local_80;
      fVar8 = *local_60 - local_84;
      fVar8 = (float)(~-(uint)(fVar8 <= 0.0) & (uint)fVar8);
      fVar9 = -fVar7;
      uVar5 = -(uint)(fVar7 <= fVar9);
      fVar7 = (float)(~uVar5 & (uint)fVar9 | uVar5 & 0x80000000);
      if (fVar7 <= fVar6) {
        fVar7 = fVar6;
      }
      if (fVar7 <= fVar8) {
        fVar8 = fVar7;
      }
      if ((fVar8 != 0.0) || (NAN(fVar8))) {
        fVar6 = *local_68 + fVar8;
        if ((fVar8 < 0.0) && (fVar6 < local_80)) {
          __assert_fail("*size1 + mouse_delta >= min_size1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                        ,0x537,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float)"
                       );
        }
        fVar7 = 0.0;
        if ((0.0 < fVar8) && (*local_60 - fVar8 < local_84)) {
          __assert_fail("*size2 - mouse_delta >= min_size2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                        ,0x539,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float)"
                       );
        }
        *local_68 = fVar6;
        *local_60 = *local_60 - fVar8;
        fVar6 = fVar8;
        if (axis == ImGuiAxis_X) {
          fVar6 = 0.0;
          fVar7 = fVar8;
        }
        local_78.y = local_78.y + fVar6;
        local_78.x = local_78.x + fVar7;
        IStack_70.y = fVar6 + IStack_70.y;
        IStack_70.x = fVar7 + IStack_70.x;
        MarkItemEdited(id);
      }
    }
    idx = 0x1d;
    if ((local_8a == false) && (idx = 0x1b, local_89 == true)) {
      idx = 0x1c - (uint)(pIVar2->HoveredIdTimer < local_88);
    }
    col = GetColorU32(idx,1.0);
    ImDrawList::AddRectFilled
              (local_40->DrawList,&local_78,&IStack_70,col,(pIVar2->Style).FrameRounding,0xf);
    cVar4 = local_8a;
  }
  return (bool)cVar4;
}

Assistant:

bool ImGui::SplitterBehavior(const ImRect& bb, ImGuiID id, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend, float hover_visibility_delay)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    window->DC.ItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (g.HoveredId == id && g.HoveredIdPreviousFrame == id && g.HoveredIdTimer >= hover_visibility_delay))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        float size_1_maximum_delta = ImMax(0.0f, *size1 - min_size1);
        float size_2_maximum_delta = ImMax(0.0f, *size2 - min_size2);
        if (mouse_delta < -size_1_maximum_delta)
            mouse_delta = -size_1_maximum_delta;
        if (mouse_delta > size_2_maximum_delta)
            mouse_delta = size_2_maximum_delta;

        // Apply resize
        if (mouse_delta != 0.0f)
        {
            if (mouse_delta < 0.0f)
                IM_ASSERT(*size1 + mouse_delta >= min_size1);
            if (mouse_delta > 0.0f)
                IM_ASSERT(*size2 - mouse_delta >= min_size2);
            *size1 += mouse_delta;
            *size2 -= mouse_delta;
            bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
            MarkItemEdited(id);
        }
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : (hovered && g.HoveredIdTimer >= hover_visibility_delay) ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, g.Style.FrameRounding);

    return held;
}